

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::setRowVisible(QFormLayout *this,QWidget *widget,bool on)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QFormLayoutPrivate *rowPtr;
  byte in_DL;
  QMessageLogger *in_RSI;
  ItemRole *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutPrivate *d;
  ItemRole role;
  int row;
  undefined7 in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffe0;
  QLayoutPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  rowPtr = d_func((QFormLayout *)0x4b8a66);
  bVar3 = QLayoutPrivate::checkWidget(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    getWidgetPosition((QFormLayout *)in_RSI,(QWidget *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),
                      (int *)rowPtr,in_RDI);
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),(int)((ulong)rowPtr >> 0x20)
               ,(char *)in_RDI);
    QMessageLogger::warning(&stack0xffffffffffffffd0,"QFormLayout::setRowVisible: Invalid widget");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::setRowVisible(QWidget *widget, bool on)
{
    Q_D(QFormLayout);
    if (Q_UNLIKELY(!d->checkWidget(widget)))
        return;

    int row;
    ItemRole role;
    getWidgetPosition(widget, &row, &role);

    if (Q_UNLIKELY(row < 0)) {
        qWarning("QFormLayout::setRowVisible: Invalid widget");
        return;
    }

    setRowVisible(row, on);
}